

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O3

shared_ptr<duckdb::ListColumnData,_true> __thiscall
duckdb::SharedConstructor::
Create<duckdb::ListColumnData,duckdb::BlockManager&,duckdb::DataTableInfo&,unsigned_long&,unsigned_long&,duckdb::LogicalType_const&,duckdb::optional_ptr<duckdb::ColumnData,true>&>
          (SharedConstructor *this,BlockManager *args,DataTableInfo *args_1,unsigned_long *args_2,
          unsigned_long *args_3,LogicalType *args_4,optional_ptr<duckdb::ColumnData,_true> *args_5)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  shared_ptr<duckdb::ListColumnData,_true> sVar2;
  undefined1 local_21;
  ListColumnData *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_18;
  
  local_20 = (ListColumnData *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::ListColumnData,std::allocator<duckdb::ListColumnData>,duckdb::BlockManager&,duckdb::DataTableInfo&,unsigned_long&,unsigned_long&,duckdb::LogicalType_const&,duckdb::optional_ptr<duckdb::ColumnData,true>&>
            (&local_18,&local_20,(allocator<duckdb::ListColumnData> *)&local_21,args,args_1,args_2,
             args_3,args_4,args_5);
  *(ListColumnData **)this = local_20;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = local_18._M_pi;
  _Var1._M_pi = extraout_RDX;
  if (local_18._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_18._M_pi)->_M_use_count = (local_18._M_pi)->_M_use_count + 1;
      UNLOCK();
      if (local_18._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_006323b1;
    }
    else {
      (local_18._M_pi)->_M_use_count = (local_18._M_pi)->_M_use_count + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18._M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
LAB_006323b1:
  sVar2.internal.super___shared_ptr<duckdb::ListColumnData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var1._M_pi;
  sVar2.internal.super___shared_ptr<duckdb::ListColumnData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::ListColumnData,_true>)
         sVar2.internal.super___shared_ptr<duckdb::ListColumnData,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static shared_ptr<T> Create(ARGS &&...args) {
		return make_shared_ptr<T>(std::forward<ARGS>(args)...);
	}